

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode curl_url_get(CURLU *u,CURLUPart what,char **part,uint flags)

{
  char *pcVar1;
  int iVar2;
  CURLcode CVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  bool bVar12;
  char *local_1d8;
  char *local_1c0;
  char *local_1a0;
  char *local_180;
  Curl_handler *local_168;
  char *local_148;
  char *local_130;
  char *local_118;
  char *local_100;
  CURLcode res;
  size_t dlen;
  char *decoded;
  char *plus;
  size_t alen;
  size_t hostlen;
  Curl_handler *h_2;
  char *allochost;
  char *port;
  char *options;
  char *scheme;
  char *url;
  Curl_handler *h_1;
  Curl_handler *h;
  _Bool plusdecode;
  _Bool urldecode;
  char portbuf [7];
  CURLUcode ifmissing;
  char *ptr;
  uint flags_local;
  char **part_local;
  CURLUPart what_local;
  CURLU *u_local;
  
  _urldecode = CURLUE_UNKNOWN_PART;
  h._4_1_ = (flags & 0x40) != 0;
  h._3_1_ = 0;
  if (u == (CURLU *)0x0) {
    u_local._4_4_ = CURLUE_BAD_HANDLE;
  }
  else if (part == (char **)0x0) {
    u_local._4_4_ = CURLUE_BAD_PARTPOINTER;
  }
  else {
    *part = (char *)0x0;
    switch(what) {
    case CURLUPART_URL:
      port = u->options;
      allochost = u->port;
      h_2 = (Curl_handler *)0x0;
      if ((u->scheme == (char *)0x0) || (iVar2 = Curl_strcasecompare("file",u->scheme), iVar2 == 0))
      {
        if (u->host == (char *)0x0) {
          return CURLUE_NO_HOST;
        }
        hostlen = 0;
        if (u->scheme == (char *)0x0) {
          if ((flags & 4) == 0) {
            return CURLUE_NO_SCHEME;
          }
          options = "https";
        }
        else {
          options = u->scheme;
        }
        if (options != (char *)0x0) {
          hostlen = (size_t)Curl_builtin_scheme(options);
          if ((allochost == (char *)0x0) && ((flags & 1) != 0)) {
            if ((Curl_handler *)hostlen != (Curl_handler *)0x0) {
              curl_msnprintf((char *)((long)&h + 5),7,"%ld",((Curl_handler *)hostlen)->defport);
              allochost = (char *)((long)&h + 5);
            }
          }
          else if ((allochost != (char *)0x0) &&
                  ((((Curl_handler *)hostlen != (Curl_handler *)0x0 &&
                    (((Curl_handler *)hostlen)->defport == u->portnum)) && ((flags & 2) != 0)))) {
            allochost = (char *)0x0;
          }
        }
        if ((hostlen != 0) && ((*(uint *)(hostlen + 0x84) & 0x400) == 0)) {
          port = (char *)0x0;
        }
        if ((*u->host == '[') && (u->zoneid != (char *)0x0)) {
          sVar4 = strlen(u->host);
          alen = sVar4;
          sVar5 = strlen(u->zoneid);
          plus = (char *)(sVar4 + sVar5 + 4);
          h_2 = (Curl_handler *)(*Curl_cmalloc)((size_t)plus);
          if (h_2 == (Curl_handler *)0x0) {
            return CURLUE_OUT_OF_MEMORY;
          }
          memcpy(h_2,u->host,alen - 1);
          curl_msnprintf((char *)((long)h_2 + (alen - 1)),(size_t)(plus + (1 - alen)),"%%25%s]",
                         u->zoneid);
        }
        if (u->user == (char *)0x0) {
          local_118 = "";
        }
        else {
          local_118 = u->user;
        }
        pcVar11 = "PK\x01\x02";
        if (u->password != (char *)0x0) {
          pcVar11 = "    :";
        }
        if (u->password == (char *)0x0) {
          local_130 = "";
        }
        else {
          local_130 = u->password;
        }
        pcVar6 = "";
        if (port == (char *)0x0) {
          local_148 = "";
        }
        else {
          pcVar6 = ";";
          local_148 = port;
        }
        bVar12 = true;
        if ((u->user == (char *)0x0) && (bVar12 = true, u->password == (char *)0x0)) {
          bVar12 = port != (char *)0x0;
        }
        pcVar7 = "";
        if (bVar12) {
          pcVar7 = "@";
        }
        if (h_2 == (Curl_handler *)0x0) {
          local_168 = (Curl_handler *)u->host;
        }
        else {
          local_168 = h_2;
        }
        pcVar1 = "PK\x01\x02";
        if (allochost == (char *)0x0) {
          local_180 = "";
        }
        else {
          pcVar1 = "    :";
          local_180 = allochost;
        }
        bVar12 = false;
        if (u->path != (char *)0x0) {
          bVar12 = *u->path != '/';
        }
        pcVar8 = "";
        if (bVar12) {
          pcVar8 = "/";
        }
        if (u->path == (char *)0x0) {
          local_1a0 = "/";
        }
        else {
          local_1a0 = u->path;
        }
        bVar12 = false;
        if (u->query != (char *)0x0) {
          bVar12 = *u->query != '\0';
        }
        pcVar9 = "";
        if (bVar12) {
          pcVar9 = "?";
        }
        if ((u->query == (char *)0x0) || (*u->query == '\0')) {
          local_1c0 = "";
        }
        else {
          local_1c0 = u->query;
        }
        pcVar10 = "";
        if (u->fragment != (char *)0x0) {
          pcVar10 = "#";
        }
        if (u->fragment == (char *)0x0) {
          local_1d8 = "";
        }
        else {
          local_1d8 = u->fragment;
        }
        scheme = curl_maprintf("%s://%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s",options,local_118,pcVar11 + 4,
                               local_130,pcVar6,local_148,pcVar7,local_168,pcVar1 + 4,local_180,
                               pcVar8,local_1a0,pcVar9,local_1c0,pcVar10,local_1d8);
        (*Curl_cfree)(h_2);
      }
      else {
        pcVar11 = "";
        if (u->fragment != (char *)0x0) {
          pcVar11 = "#";
        }
        if (u->fragment == (char *)0x0) {
          local_100 = "";
        }
        else {
          local_100 = u->fragment;
        }
        scheme = curl_maprintf("file://%s%s%s",u->path,pcVar11,local_100);
      }
      if (scheme == (char *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      *part = scheme;
      return CURLUE_OK;
    case CURLUPART_SCHEME:
      unique0x00012000 = u->scheme;
      _urldecode = CURLUE_NO_SCHEME;
      h._4_1_ = 0;
      break;
    case CURLUPART_USER:
      unique0x00012000 = u->user;
      _urldecode = CURLUE_NO_USER;
      break;
    case CURLUPART_PASSWORD:
      unique0x00012000 = u->password;
      _urldecode = CURLUE_NO_PASSWORD;
      break;
    case CURLUPART_OPTIONS:
      unique0x00012000 = u->options;
      _urldecode = CURLUE_NO_OPTIONS;
      break;
    case CURLUPART_HOST:
      unique0x00012000 = u->host;
      _urldecode = CURLUE_NO_HOST;
      break;
    case CURLUPART_PORT:
      unique0x00012000 = u->port;
      _urldecode = CURLUE_NO_PORT;
      h._4_1_ = 0;
      if (((unique0x00012000 == (char *)0x0) && ((flags & 1) != 0)) && (u->scheme != (char *)0x0)) {
        h_1 = Curl_builtin_scheme(u->scheme);
        if (h_1 != (Curl_handler *)0x0) {
          curl_msnprintf((char *)((long)&h + 5),7,"%ld",h_1->defport);
          unique0x00004780 = (char *)((long)&h + 5);
        }
      }
      else if (((unique0x00012000 != (char *)0x0) && (u->scheme != (char *)0x0)) &&
              ((url = (char *)Curl_builtin_scheme(u->scheme),
               (Curl_handler *)url != (Curl_handler *)0x0 &&
               ((((Curl_handler *)url)->defport == u->portnum && ((flags & 2) != 0)))))) {
        stack0xffffffffffffffa0 = (char *)0x0;
      }
      break;
    case CURLUPART_PATH:
      unique0x00012000 = u->path;
      if (unique0x00012000 == (char *)0x0) {
        register0x00000000 = (*Curl_cstrdup)("/");
        u->path = register0x00000000;
        if (u->path == (char *)0x0) {
          return CURLUE_OUT_OF_MEMORY;
        }
      }
      break;
    case CURLUPART_QUERY:
      unique0x00012000 = u->query;
      _urldecode = CURLUE_NO_QUERY;
      h._3_1_ = h._4_1_;
      break;
    case CURLUPART_FRAGMENT:
      unique0x00012000 = u->fragment;
      _urldecode = CURLUE_NO_FRAGMENT;
      break;
    case CURLUPART_ZONEID:
      unique0x00012000 = u->zoneid;
      break;
    default:
      stack0xffffffffffffffa0 = (char *)0x0;
    }
    if (stack0xffffffffffffffa0 == (char *)0x0) {
      u_local._4_4_ = _urldecode;
    }
    else {
      pcVar11 = (*Curl_cstrdup)(stack0xffffffffffffffa0);
      *part = pcVar11;
      if (*part == (char *)0x0) {
        u_local._4_4_ = CURLUE_OUT_OF_MEMORY;
      }
      else {
        if ((h._3_1_ & 1) != 0) {
          for (decoded = *part; *decoded != '\0'; decoded = decoded + 1) {
            if (*decoded == '+') {
              *decoded = ' ';
            }
          }
        }
        if ((h._4_1_ & 1) != 0) {
          CVar3 = Curl_urldecode((Curl_easy *)0x0,*part,0,(char **)&dlen,
                                 (size_t *)&stack0xffffffffffffff28,true);
          (*Curl_cfree)(*part);
          if (CVar3 != CURLE_OK) {
            *part = (char *)0x0;
            return CURLUE_URLDECODE;
          }
          *part = (char *)dlen;
        }
        u_local._4_4_ = CURLUE_OK;
      }
    }
  }
  return u_local._4_4_;
}

Assistant:

CURLUcode curl_url_get(CURLU *u, CURLUPart what,
                       char **part, unsigned int flags)
{
  char *ptr;
  CURLUcode ifmissing = CURLUE_UNKNOWN_PART;
  char portbuf[7];
  bool urldecode = (flags & CURLU_URLDECODE)?1:0;
  bool plusdecode = FALSE;
  (void)flags;
  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part)
    return CURLUE_BAD_PARTPOINTER;
  *part = NULL;

  switch(what) {
  case CURLUPART_SCHEME:
    ptr = u->scheme;
    ifmissing = CURLUE_NO_SCHEME;
    urldecode = FALSE; /* never for schemes */
    break;
  case CURLUPART_USER:
    ptr = u->user;
    ifmissing = CURLUE_NO_USER;
    break;
  case CURLUPART_PASSWORD:
    ptr = u->password;
    ifmissing = CURLUE_NO_PASSWORD;
    break;
  case CURLUPART_OPTIONS:
    ptr = u->options;
    ifmissing = CURLUE_NO_OPTIONS;
    break;
  case CURLUPART_HOST:
    ptr = u->host;
    ifmissing = CURLUE_NO_HOST;
    break;
  case CURLUPART_ZONEID:
    ptr = u->zoneid;
    break;
  case CURLUPART_PORT:
    ptr = u->port;
    ifmissing = CURLUE_NO_PORT;
    urldecode = FALSE; /* never for port */
    if(!ptr && (flags & CURLU_DEFAULT_PORT) && u->scheme) {
      /* there's no stored port number, but asked to deliver
         a default one for the scheme */
      const struct Curl_handler *h =
        Curl_builtin_scheme(u->scheme);
      if(h) {
        msnprintf(portbuf, sizeof(portbuf), "%ld", h->defport);
        ptr = portbuf;
      }
    }
    else if(ptr && u->scheme) {
      /* there is a stored port number, but ask to inhibit if
         it matches the default one for the scheme */
      const struct Curl_handler *h =
        Curl_builtin_scheme(u->scheme);
      if(h && (h->defport == u->portnum) &&
         (flags & CURLU_NO_DEFAULT_PORT))
        ptr = NULL;
    }
    break;
  case CURLUPART_PATH:
    ptr = u->path;
    if(!ptr) {
      ptr = u->path = strdup("/");
      if(!u->path)
        return CURLUE_OUT_OF_MEMORY;
    }
    break;
  case CURLUPART_QUERY:
    ptr = u->query;
    ifmissing = CURLUE_NO_QUERY;
    plusdecode = urldecode;
    break;
  case CURLUPART_FRAGMENT:
    ptr = u->fragment;
    ifmissing = CURLUE_NO_FRAGMENT;
    break;
  case CURLUPART_URL: {
    char *url;
    char *scheme;
    char *options = u->options;
    char *port = u->port;
    char *allochost = NULL;
    if(u->scheme && strcasecompare("file", u->scheme)) {
      url = aprintf("file://%s%s%s",
                    u->path,
                    u->fragment? "#": "",
                    u->fragment? u->fragment : "");
    }
    else if(!u->host)
      return CURLUE_NO_HOST;
    else {
      const struct Curl_handler *h = NULL;
      if(u->scheme)
        scheme = u->scheme;
      else if(flags & CURLU_DEFAULT_SCHEME)
        scheme = (char *) DEFAULT_SCHEME;
      else
        return CURLUE_NO_SCHEME;

      if(scheme) {
        h = Curl_builtin_scheme(scheme);
        if(!port && (flags & CURLU_DEFAULT_PORT)) {
          /* there's no stored port number, but asked to deliver
             a default one for the scheme */
          if(h) {
            msnprintf(portbuf, sizeof(portbuf), "%ld", h->defport);
            port = portbuf;
          }
        }
        else if(port) {
          /* there is a stored port number, but asked to inhibit if it matches
             the default one for the scheme */
          if(h && (h->defport == u->portnum) &&
             (flags & CURLU_NO_DEFAULT_PORT))
            port = NULL;
        }
      }
      if(h && !(h->flags & PROTOPT_URLOPTIONS))
        options = NULL;

      if((u->host[0] == '[') && u->zoneid) {
        /* make it '[ host %25 zoneid ]' */
        size_t hostlen = strlen(u->host);
        size_t alen = hostlen + 3 + strlen(u->zoneid) + 1;
        allochost = malloc(alen);
        if(!allochost)
          return CURLUE_OUT_OF_MEMORY;
        memcpy(allochost, u->host, hostlen - 1);
        msnprintf(&allochost[hostlen - 1], alen - hostlen + 1,
                  "%%25%s]", u->zoneid);
      }

      url = aprintf("%s://%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s",
                    scheme,
                    u->user ? u->user : "",
                    u->password ? ":": "",
                    u->password ? u->password : "",
                    options ? ";" : "",
                    options ? options : "",
                    (u->user || u->password || options) ? "@": "",
                    allochost ? allochost : u->host,
                    port ? ":": "",
                    port ? port : "",
                    (u->path && (u->path[0] != '/')) ? "/": "",
                    u->path ? u->path : "/",
                    (u->query && u->query[0]) ? "?": "",
                    (u->query && u->query[0]) ? u->query : "",
                    u->fragment? "#": "",
                    u->fragment? u->fragment : "");
      free(allochost);
    }
    if(!url)
      return CURLUE_OUT_OF_MEMORY;
    *part = url;
    return CURLUE_OK;
  }
  default:
    ptr = NULL;
    break;
  }
  if(ptr) {
    *part = strdup(ptr);
    if(!*part)
      return CURLUE_OUT_OF_MEMORY;
    if(plusdecode) {
      /* convert + to space */
      char *plus;
      for(plus = *part; *plus; ++plus) {
        if(*plus == '+')
          *plus = ' ';
      }
    }
    if(urldecode) {
      char *decoded;
      size_t dlen;
      CURLcode res = Curl_urldecode(NULL, *part, 0, &decoded, &dlen, TRUE);
      free(*part);
      if(res) {
        *part = NULL;
        return CURLUE_URLDECODE;
      }
      *part = decoded;
    }
    return CURLUE_OK;
  }
  else
    return ifmissing;
}